

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O2

int ebur128_gated_loudness(ebur128_state **sts,size_t size,double *out)

{
  double dVar1;
  ebur128_state_internal *peVar2;
  unsigned_long uVar3;
  ebur128_dq_entry *peVar4;
  size_t sVar5;
  long lVar6;
  size_t sVar7;
  ebur128_double_queue *peVar8;
  double *pdVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double energy;
  size_t local_48;
  double local_40;
  double local_38;
  
  local_40 = 0.0;
  local_48 = 0;
  sVar5 = 0;
  while( true ) {
    if (size == sVar5) {
      for (sVar5 = 0; size != sVar5; sVar5 = sVar5 + 1) {
        if (sts[sVar5] != (ebur128_state *)0x0) {
          ebur128_calc_relative_threshold(sts[sVar5],&local_48,&local_40);
        }
      }
      dVar15 = -INFINITY;
      if (local_48 != 0) {
        auVar12._8_4_ = (int)(local_48 >> 0x20);
        auVar12._0_8_ = local_48;
        auVar12._12_4_ = 0x45300000;
        energy = (local_40 /
                 ((auVar12._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0))) *
                 relative_gate_factor;
        if (histogram_energy_boundaries[0] <= energy) {
          local_38 = energy;
          sVar5 = find_histogram_index(energy);
          energy = local_38;
          if (histogram_energies[sVar5] <= local_38 && local_38 != histogram_energies[sVar5]) {
            sVar5 = sVar5 + 1;
          }
        }
        else {
          sVar5 = 0;
        }
        dVar15 = -INFINITY;
        dVar11 = 0.0;
        lVar6 = 0;
        for (sVar7 = 0; sVar7 != size; sVar7 = sVar7 + 1) {
          if (sts[sVar7] != (ebur128_state *)0x0) {
            peVar2 = sts[sVar7]->d;
            pdVar9 = histogram_energies + sVar5;
            uVar10 = sVar5;
            if (peVar2->use_histogram == 0) {
              peVar8 = &peVar2->block_list;
              while (peVar4 = peVar8->stqh_first, peVar4 != (ebur128_dq_entry *)0x0) {
                dVar1 = peVar4->z;
                lVar6 = (lVar6 + 1) - (ulong)(dVar1 < energy);
                if (energy <= dVar1) {
                  dVar11 = dVar11 + dVar1;
                }
                peVar8 = (ebur128_double_queue *)&peVar4->entries;
              }
            }
            else {
              for (; uVar10 < 1000; uVar10 = uVar10 + 1) {
                uVar3 = peVar2->block_energy_histogram[uVar10];
                auVar14._8_4_ = (int)(uVar3 >> 0x20);
                auVar14._0_8_ = uVar3;
                auVar14._12_4_ = 0x45300000;
                dVar11 = dVar11 + ((auVar14._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                                  *pdVar9;
                lVar6 = lVar6 + uVar3;
                pdVar9 = pdVar9 + 1;
              }
            }
          }
        }
        if (lVar6 != 0) {
          auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
          auVar13._0_8_ = lVar6;
          auVar13._12_4_ = 0x45300000;
          dVar15 = ebur128_energy_to_loudness
                             (dVar11 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0
                                       )));
        }
      }
      *out = dVar15;
      return 0;
    }
    if ((sts[sVar5] != (ebur128_state *)0x0) && ((~sts[sVar5]->mode & 5U) != 0)) break;
    sVar5 = sVar5 + 1;
  }
  return 2;
}

Assistant:

static int
ebur128_gated_loudness(ebur128_state** sts, size_t size, double* out) {
  struct ebur128_dq_entry* it;
  double gated_loudness = 0.0;
  double relative_threshold = 0.0;
  size_t above_thresh_counter = 0;
  size_t i, j, start_index;

  for (i = 0; i < size; i++) {
    if (sts[i] && (sts[i]->mode & EBUR128_MODE_I) != EBUR128_MODE_I) {
      return EBUR128_ERROR_INVALID_MODE;
    }
  }

  for (i = 0; i < size; i++) {
    if (!sts[i]) {
      continue;
    }
    ebur128_calc_relative_threshold(sts[i], &above_thresh_counter,
                                    &relative_threshold);
  }
  if (!above_thresh_counter) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }

  relative_threshold /= (double) above_thresh_counter;
  relative_threshold *= relative_gate_factor;

  above_thresh_counter = 0;
  if (relative_threshold < histogram_energy_boundaries[0]) {
    start_index = 0;
  } else {
    start_index = find_histogram_index(relative_threshold);
    if (relative_threshold > histogram_energies[start_index]) {
      ++start_index;
    }
  }
  for (i = 0; i < size; i++) {
    if (!sts[i]) {
      continue;
    }
    if (sts[i]->d->use_histogram) {
      for (j = start_index; j < 1000; ++j) {
        gated_loudness +=
            sts[i]->d->block_energy_histogram[j] * histogram_energies[j];
        above_thresh_counter += sts[i]->d->block_energy_histogram[j];
      }
    } else {
      STAILQ_FOREACH(it, &sts[i]->d->block_list, entries) {
        if (it->z >= relative_threshold) {
          ++above_thresh_counter;
          gated_loudness += it->z;
        }
      }
    }
  }
  if (!above_thresh_counter) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }
  gated_loudness /= (double) above_thresh_counter;
  *out = ebur128_energy_to_loudness(gated_loudness);
  return EBUR128_SUCCESS;
}